

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons1.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  pthread_t tid_consumer;
  pthread_t tid_producer;
  pthread_t local_30;
  pthread_t local_28;
  
  if (argc != 2) {
    main_cold_1();
  }
  nitems = atoi(argv[1]);
  sem_unlink("/sem_mutex");
  sem_unlink("/sem_nempty");
  sem_unlink("/sem_nstored");
  uVar1 = _FILE_MODE;
  shared.mutex = (sem_t *)sem_open("/sem_mutex",0xc0,(ulong)_FILE_MODE,1);
  shared.nempty = (sem_t *)sem_open("/sem_nempty",0xc0,(ulong)uVar1);
  shared.nstored = (sem_t *)sem_open("/sem_nstored",0xc0,(ulong)uVar1);
  if (shared.mutex == (sem_t *)0x0) {
    main_cold_2();
  }
  if (shared.nempty == (sem_t *)0x0) {
    main_cold_3();
  }
  if (shared.nstored == (sem_t *)0x0) {
    main_cold_4();
  }
  iVar2 = pthread_create(&local_28,(pthread_attr_t *)0x0,producer,(void *)0x0);
  if (iVar2 != 0) {
    main_cold_5();
  }
  iVar2 = pthread_create(&local_30,(pthread_attr_t *)0x0,consumer,(void *)0x0);
  if (iVar2 != 0) {
    main_cold_6();
  }
  iVar2 = pthread_join(local_28,(void **)0x0);
  if (iVar2 != 0) {
    main_cold_7();
  }
  iVar2 = pthread_join(local_30,(void **)0x0);
  if (iVar2 != 0) {
    main_cold_8();
  }
  iVar2 = sem_unlink("/sem_mutex");
  if (iVar2 != 0) {
    main_cold_9();
  }
  iVar2 = sem_unlink("/sem_nempty");
  if (iVar2 != 0) {
    main_cold_10();
  }
  iVar2 = sem_unlink("/sem_nstored");
  if (iVar2 != 0) {
    main_cold_11();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  pthread_t tid_producer, tid_consumer;

  ASSERT_ERR_QUIT(argc == 2, "usage: %s [number of items]", argv[0]);

  nitems = atoi(argv[1]);

  sem_unlink(SEM_MUTEX);
  sem_unlink(SEM_NEMPTY);  
  sem_unlink(SEM_NSTORED);  

  shared.mutex = sem_open(SEM_MUTEX, O_CREAT | O_EXCL, FILE_MODE, 1);
  shared.nempty = sem_open(SEM_NEMPTY, O_CREAT | O_EXCL, FILE_MODE, NBUFF);
  shared.nstored = sem_open(SEM_NSTORED, O_CREAT | O_EXCL, FILE_MODE, 0);

  ASSERT_ERR_QUIT(shared.mutex != SEM_FAILED, "Failed to create semaphore mutex: %d", errno);
  ASSERT_ERR_QUIT(shared.nempty != SEM_FAILED, "Failed to create semaphore nempty: %d", errno);
  ASSERT_ERR_QUIT(shared.nstored != SEM_FAILED, "Failed to create semaphore nstored: %d", errno);

  ASSERT_ERR_QUIT(pthread_create(&tid_producer, NULL, &producer, NULL) == 0, 
    "Failed to create producer thread");
  ASSERT_ERR_QUIT(pthread_create(&tid_consumer, NULL, &consumer, NULL) == 0,
    "Failed to create consumer thread");

  ASSERT_ERR_QUIT(pthread_join(tid_producer, NULL) == 0, 
    "Failed to join producer thread: %ld", tid_producer);
  ASSERT_ERR_QUIT(pthread_join(tid_consumer, NULL) == 0, 
    "Failed to join consumer thread: %ld", tid_consumer);
  
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_MUTEX), "Failed to unlink semaphore mutex");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NEMPTY), "Failed to unlink semaphore nempty");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NSTORED), "Failed to unlink semaphore nstored");

  return 0;
}